

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-def.cpp
# Opt level: O2

void __thiscall JitFFI::JitFuncCallerCreaterX64::push(JitFuncCallerCreaterX64 *this,uint64_t dat)

{
  OpCode_x64::movq_u64(this->data,rax,dat);
  JitFuncCreater::push(this->data,'P');
  this->push_count = this->push_count + 1;
  return;
}

Assistant:

void JitFuncCallerCreaterX64::push(uint64_t dat) {
		OpCode_x64::movq_u64(data, OpCode_x64::rax, dat);
		OpCode_x64::push(data, OpCode_x64::rax);
		push_count += 1;
	}